

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O3

uint64_t __thiscall mkvmuxer::Projection::PayloadSize(Projection *this)

{
  uint64 uVar1;
  uint64 uVar2;
  uint64 uVar3;
  uint64 uVar4;
  
  uVar1 = EbmlElementSize(0x7670,(long)this->type_);
  if ((this->private_data_length_ != 0) && (this->private_data_ != (uint8 *)0x0)) {
    uVar2 = EbmlElementSize(0x7672,this->private_data_,this->private_data_length_);
    uVar1 = uVar1 + uVar2;
  }
  uVar2 = EbmlElementSize(0x7673,this->pose_yaw_);
  uVar3 = EbmlElementSize(0x7674,this->pose_pitch_);
  uVar4 = EbmlElementSize(0x7675,this->pose_roll_);
  return uVar4 + uVar3 + uVar2 + uVar1;
}

Assistant:

uint64_t Projection::PayloadSize() const {
  uint64_t size =
      EbmlElementSize(libwebm::kMkvProjection, static_cast<uint64>(type_));

  if (private_data_length_ > 0 && private_data_ != NULL) {
    size += EbmlElementSize(libwebm::kMkvProjectionPrivate, private_data_,
                            private_data_length_);
  }

  size += EbmlElementSize(libwebm::kMkvProjectionPoseYaw, pose_yaw_);
  size += EbmlElementSize(libwebm::kMkvProjectionPosePitch, pose_pitch_);
  size += EbmlElementSize(libwebm::kMkvProjectionPoseRoll, pose_roll_);

  return size;
}